

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void glcts::prepareTextureCoordinatesForGatherForFace
               (GLfloat *data,GLuint width,GLuint height,GLfloat layer,GLuint face)

{
  float fVar1;
  float x;
  float y;
  float fVar2;
  GLfloat positive;
  GLfloat negative;
  GLfloat middle;
  GLfloat bottom;
  GLfloat top;
  GLfloat right;
  GLfloat left;
  GLfloat y_mid_step;
  GLfloat x_mid_step;
  GLfloat y_step;
  GLfloat x_step;
  GLfloat y_range;
  GLfloat x_range;
  GLuint face_local;
  GLfloat layer_local;
  GLuint height_local;
  GLuint width_local;
  GLfloat *data_local;
  
  fVar2 = 2.0 / (float)width;
  fVar1 = 2.0 / (float)height;
  x = fVar2 * 0.5 + -1.0 + fVar2;
  fVar2 = (1.0 - fVar2 * 0.5) - fVar2;
  y = (1.0 - fVar1 * 0.5) - fVar1;
  fVar1 = fVar1 * 0.5 + -1.0 + fVar1;
  switch(face) {
  case 0:
    vectorSet4(data,0,1.0,x,y,layer);
    vectorSet4(data,1,1.0,0.0,y,layer);
    vectorSet4(data,2,1.0,fVar2,y,layer);
    vectorSet4(data,3,1.0,x,0.0,layer);
    vectorSet4(data,4,1.0,0.0,0.0,layer);
    vectorSet4(data,5,1.0,fVar2,0.0,layer);
    vectorSet4(data,6,1.0,x,fVar1,layer);
    vectorSet4(data,7,1.0,0.0,fVar1,layer);
    vectorSet4(data,8,1.0,fVar2,fVar1,layer);
    break;
  case 1:
    vectorSet4(data,0,-1.0,x,y,layer);
    vectorSet4(data,1,-1.0,0.0,y,layer);
    vectorSet4(data,2,-1.0,fVar2,y,layer);
    vectorSet4(data,3,-1.0,x,0.0,layer);
    vectorSet4(data,4,-1.0,0.0,0.0,layer);
    vectorSet4(data,5,-1.0,fVar2,0.0,layer);
    vectorSet4(data,6,-1.0,x,fVar1,layer);
    vectorSet4(data,7,-1.0,0.0,fVar1,layer);
    vectorSet4(data,8,-1.0,fVar2,fVar1,layer);
    break;
  case 2:
    vectorSet4(data,0,x,1.0,y,layer);
    vectorSet4(data,1,0.0,1.0,y,layer);
    vectorSet4(data,2,fVar2,1.0,y,layer);
    vectorSet4(data,3,x,1.0,0.0,layer);
    vectorSet4(data,4,0.0,1.0,0.0,layer);
    vectorSet4(data,5,fVar2,1.0,0.0,layer);
    vectorSet4(data,6,x,1.0,fVar1,layer);
    vectorSet4(data,7,0.0,1.0,fVar1,layer);
    vectorSet4(data,8,fVar2,1.0,fVar1,layer);
    break;
  case 3:
    vectorSet4(data,0,x,-1.0,y,layer);
    vectorSet4(data,1,0.0,-1.0,y,layer);
    vectorSet4(data,2,fVar2,-1.0,y,layer);
    vectorSet4(data,3,x,-1.0,0.0,layer);
    vectorSet4(data,4,0.0,-1.0,0.0,layer);
    vectorSet4(data,5,fVar2,-1.0,0.0,layer);
    vectorSet4(data,6,x,-1.0,fVar1,layer);
    vectorSet4(data,7,0.0,-1.0,fVar1,layer);
    vectorSet4(data,8,fVar2,-1.0,fVar1,layer);
    break;
  case 4:
    vectorSet4(data,0,x,y,1.0,layer);
    vectorSet4(data,1,0.0,y,1.0,layer);
    vectorSet4(data,2,fVar2,y,1.0,layer);
    vectorSet4(data,3,x,0.0,1.0,layer);
    vectorSet4(data,4,0.0,0.0,1.0,layer);
    vectorSet4(data,5,fVar2,0.0,1.0,layer);
    vectorSet4(data,6,x,fVar1,1.0,layer);
    vectorSet4(data,7,0.0,fVar1,1.0,layer);
    vectorSet4(data,8,fVar2,fVar1,1.0,layer);
    break;
  case 5:
    vectorSet4(data,0,x,y,-1.0,layer);
    vectorSet4(data,1,0.0,y,-1.0,layer);
    vectorSet4(data,2,fVar2,y,-1.0,layer);
    vectorSet4(data,3,x,0.0,-1.0,layer);
    vectorSet4(data,4,0.0,0.0,-1.0,layer);
    vectorSet4(data,5,fVar2,0.0,-1.0,layer);
    vectorSet4(data,6,x,fVar1,-1.0,layer);
    vectorSet4(data,7,0.0,fVar1,-1.0,layer);
    vectorSet4(data,8,fVar2,fVar1,-1.0,layer);
  }
  vectorNormalize<3u,4u>(data,0);
  vectorNormalize<3u,4u>(data,1);
  vectorNormalize<3u,4u>(data,2);
  vectorNormalize<3u,4u>(data,3);
  vectorNormalize<3u,4u>(data,4);
  vectorNormalize<3u,4u>(data,5);
  vectorNormalize<3u,4u>(data,6);
  vectorNormalize<3u,4u>(data,7);
  vectorNormalize<3u,4u>(data,8);
  return;
}

Assistant:

void prepareTextureCoordinatesForGatherForFace(glw::GLfloat* data, glw::GLuint width, glw::GLuint height,
											   glw::GLfloat layer, glw::GLuint face)
{
	const glw::GLfloat x_range = (glw::GLfloat)width;
	const glw::GLfloat y_range = (glw::GLfloat)height;

	const glw::GLfloat x_step = 2.0f / x_range;
	const glw::GLfloat y_step = 2.0f / y_range;

	const glw::GLfloat x_mid_step = x_step / 2.0f;
	const glw::GLfloat y_mid_step = y_step / 2.0f;

	const glw::GLfloat left		= -1.0f + x_mid_step + x_step;
	const glw::GLfloat right	= 1.0f - x_mid_step - x_step;
	const glw::GLfloat top		= 1.0f - y_mid_step - y_step;
	const glw::GLfloat bottom   = -1.0f + y_mid_step + y_step;
	const glw::GLfloat middle   = 0.0f;
	const glw::GLfloat negative = -1.0f;
	const glw::GLfloat positive = 1.0f;

	switch (face)
	{
	case 0:
		vectorSet4(data, 0, positive, left, top, layer);
		vectorSet4(data, 1, positive, middle, top, layer);
		vectorSet4(data, 2, positive, right, top, layer);
		vectorSet4(data, 3, positive, left, middle, layer);
		vectorSet4(data, 4, positive, middle, middle, layer);
		vectorSet4(data, 5, positive, right, middle, layer);
		vectorSet4(data, 6, positive, left, bottom, layer);
		vectorSet4(data, 7, positive, middle, bottom, layer);
		vectorSet4(data, 8, positive, right, bottom, layer);
		break;
	case 1:
		vectorSet4(data, 0, negative, left, top, layer);
		vectorSet4(data, 1, negative, middle, top, layer);
		vectorSet4(data, 2, negative, right, top, layer);
		vectorSet4(data, 3, negative, left, middle, layer);
		vectorSet4(data, 4, negative, middle, middle, layer);
		vectorSet4(data, 5, negative, right, middle, layer);
		vectorSet4(data, 6, negative, left, bottom, layer);
		vectorSet4(data, 7, negative, middle, bottom, layer);
		vectorSet4(data, 8, negative, right, bottom, layer);
		break;
	case 2:
		vectorSet4(data, 0, left, positive, top, layer);
		vectorSet4(data, 1, middle, positive, top, layer);
		vectorSet4(data, 2, right, positive, top, layer);
		vectorSet4(data, 3, left, positive, middle, layer);
		vectorSet4(data, 4, middle, positive, middle, layer);
		vectorSet4(data, 5, right, positive, middle, layer);
		vectorSet4(data, 6, left, positive, bottom, layer);
		vectorSet4(data, 7, middle, positive, bottom, layer);
		vectorSet4(data, 8, right, positive, bottom, layer);
		break;
	case 3:
		vectorSet4(data, 0, left, negative, top, layer);
		vectorSet4(data, 1, middle, negative, top, layer);
		vectorSet4(data, 2, right, negative, top, layer);
		vectorSet4(data, 3, left, negative, middle, layer);
		vectorSet4(data, 4, middle, negative, middle, layer);
		vectorSet4(data, 5, right, negative, middle, layer);
		vectorSet4(data, 6, left, negative, bottom, layer);
		vectorSet4(data, 7, middle, negative, bottom, layer);
		vectorSet4(data, 8, right, negative, bottom, layer);
		break;
	case 4:
		vectorSet4(data, 0, left, top, positive, layer);
		vectorSet4(data, 1, middle, top, positive, layer);
		vectorSet4(data, 2, right, top, positive, layer);
		vectorSet4(data, 3, left, middle, positive, layer);
		vectorSet4(data, 4, middle, middle, positive, layer);
		vectorSet4(data, 5, right, middle, positive, layer);
		vectorSet4(data, 6, left, bottom, positive, layer);
		vectorSet4(data, 7, middle, bottom, positive, layer);
		vectorSet4(data, 8, right, bottom, positive, layer);
		break;
	case 5:
		vectorSet4(data, 0, left, top, negative, layer);
		vectorSet4(data, 1, middle, top, negative, layer);
		vectorSet4(data, 2, right, top, negative, layer);
		vectorSet4(data, 3, left, middle, negative, layer);
		vectorSet4(data, 4, middle, middle, negative, layer);
		vectorSet4(data, 5, right, middle, negative, layer);
		vectorSet4(data, 6, left, bottom, negative, layer);
		vectorSet4(data, 7, middle, bottom, negative, layer);
		vectorSet4(data, 8, right, bottom, negative, layer);
		break;
	};

	vectorNormalize<3, 4>(data, 0);
	vectorNormalize<3, 4>(data, 1);
	vectorNormalize<3, 4>(data, 2);
	vectorNormalize<3, 4>(data, 3);
	vectorNormalize<3, 4>(data, 4);
	vectorNormalize<3, 4>(data, 5);
	vectorNormalize<3, 4>(data, 6);
	vectorNormalize<3, 4>(data, 7);
	vectorNormalize<3, 4>(data, 8);
}